

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv__close(int fd)

{
  int iVar1;
  int *piVar2;
  int in_EDI;
  int rc;
  int saved_errno;
  int local_c;
  
  if (in_EDI < 0) {
    __assert_fail("fd > -1","src/unix/core.c",0x1a0,"int uv__close(int)");
  }
  if (2 < in_EDI) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    local_c = close(in_EDI);
    if (local_c == -1) {
      piVar2 = __errno_location();
      local_c = -*piVar2;
      if (local_c == -4) {
        local_c = -0x73;
      }
      piVar2 = __errno_location();
      *piVar2 = iVar1;
    }
    return local_c;
  }
  __assert_fail("fd > STDERR_FILENO","src/unix/core.c",0x1a1,"int uv__close(int)");
}

Assistant:

int uv__close(int fd) {
  int saved_errno;
  int rc;

  assert(fd > -1);  /* Catch uninitialized io_watcher.fd bugs. */
  assert(fd > STDERR_FILENO);  /* Catch stdio close bugs. */

  saved_errno = errno;
  rc = close(fd);
  if (rc == -1) {
    rc = -errno;
    if (rc == -EINTR)
      rc = -EINPROGRESS;  /* For platform/libc consistency. */
    errno = saved_errno;
  }

  return rc;
}